

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O0

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)

{
  SQChar *in_RDI;
  SQInteger unaff_retaddr;
  SQInteger i;
  undefined4 in_stack_00000018;
  SQFloat in_stack_0000001c;
  HSQUIRRELVM in_stack_00000020;
  SQFUNCTION in_stack_00000028;
  HSQUIRRELVM in_stack_00000030;
  SQChar *in_stack_00000048;
  SQInteger in_stack_00000050;
  HSQUIRRELVM in_stack_00000058;
  long local_10;
  
  for (local_10 = 0; mathlib_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_stack_00000020,(SQChar *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                  (SQInteger)v);
    sq_newclosure(in_stack_00000030,in_stack_00000028,(SQUnsignedInteger)in_stack_00000020);
    sq_setparamscheck(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    sq_setnativeclosurename((HSQUIRRELVM)i,unaff_retaddr,in_RDI);
    sq_newslot((HSQUIRRELVM)CONCAT44(in_stack_0000001c,in_stack_00000018),(SQInteger)v,i);
  }
  sq_pushstring(in_stack_00000020,(SQChar *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                (SQInteger)v);
  sq_pushinteger(in_stack_00000020,CONCAT44(in_stack_0000001c,in_stack_00000018));
  sq_newslot((HSQUIRRELVM)CONCAT44(in_stack_0000001c,in_stack_00000018),(SQInteger)v,i);
  sq_pushstring(in_stack_00000020,(SQChar *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                (SQInteger)v);
  sq_pushfloat(in_stack_00000020,in_stack_0000001c);
  sq_newslot((HSQUIRRELVM)CONCAT44(in_stack_0000001c,in_stack_00000018),(SQInteger)v,i);
  return 0;
}

Assistant:

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(mathlib_funcs[i].name!=0) {
        sq_pushstring(v,mathlib_funcs[i].name,-1);
        sq_newclosure(v,mathlib_funcs[i].f,0);
        sq_setparamscheck(v,mathlib_funcs[i].nparamscheck,mathlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,mathlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_pushstring(v,_SC("RAND_MAX"),-1);
    sq_pushinteger(v,RAND_MAX);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("PI"),-1);
    sq_pushfloat(v,(SQFloat)M_PI);
    sq_newslot(v,-3,SQFalse);
    return SQ_OK;
}